

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonASTNode.cpp
# Opt level: O1

void __thiscall CommonASTNode::initialize(CommonASTNode *this,RefToken *t)

{
  uint uVar1;
  long *local_30 [2];
  long local_20 [2];
  
  uVar1 = (*t->ref->ptr->_vptr_Token[3])();
  (*(this->super_ASTNode)._vptr_ASTNode[8])(this,(ulong)uVar1);
  (*t->ref->ptr->_vptr_Token[2])(local_30);
  (*(this->super_ASTNode)._vptr_ASTNode[7])(this,local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void CommonASTNode::initialize(RefToken t)
{
	setType(t->getType()); setText(t->getText());
}